

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void rgb_ycc_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                    JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  _func_void_j_compress_ptr *p_Var3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  bool bVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  switch(cinfo->in_color_space) {
  case JCS_EXT_RGB:
    if (0 < num_rows) {
      p_Var3 = cinfo->cconvert[1].start_pass;
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar4 = (*output_buf)[output_row];
          pJVar5 = output_buf[1][output_row];
          pJVar6 = output_buf[2][output_row];
          pbVar8 = *input_buf;
          uVar11 = 0;
          do {
            uVar12 = (ulong)*pbVar8;
            uVar9 = (ulong)pbVar8[1];
            uVar10 = (ulong)pbVar8[2];
            pJVar4[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x800) +
                                  *(int *)(p_Var3 + uVar12 * 8) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x1000)) >> 0x10);
            pJVar5[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x2000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x1800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x2800)) >> 0x10);
            pJVar6[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x3000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x2800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x3800)) >> 0x10);
            uVar11 = uVar11 + 1;
            pbVar8 = pbVar8 + 3;
          } while (uVar1 != uVar11);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar7 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar7);
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    if (0 < num_rows) {
      p_Var3 = cinfo->cconvert[1].start_pass;
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar4 = (*output_buf)[output_row];
          pJVar5 = output_buf[1][output_row];
          pJVar6 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar11 = 0;
          do {
            uVar12 = (ulong)pJVar2[uVar11 * 4];
            uVar9 = (ulong)pJVar2[uVar11 * 4 + 1];
            uVar10 = (ulong)pJVar2[uVar11 * 4 + 2];
            pJVar4[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x800) +
                                  *(int *)(p_Var3 + uVar12 * 8) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x1000)) >> 0x10);
            pJVar5[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x2000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x1800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x2800)) >> 0x10);
            pJVar6[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x3000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x2800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x3800)) >> 0x10);
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar7 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar7);
    }
    break;
  case JCS_EXT_BGR:
    if (0 < num_rows) {
      p_Var3 = cinfo->cconvert[1].start_pass;
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar4 = (*output_buf)[output_row];
          pJVar5 = output_buf[1][output_row];
          pJVar6 = output_buf[2][output_row];
          pbVar8 = *input_buf + 2;
          uVar11 = 0;
          do {
            uVar12 = (ulong)*pbVar8;
            uVar9 = (ulong)pbVar8[-1];
            uVar10 = (ulong)pbVar8[-2];
            pJVar4[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x800) +
                                  *(int *)(p_Var3 + uVar12 * 8) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x1000)) >> 0x10);
            pJVar5[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x2000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x1800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x2800)) >> 0x10);
            pJVar6[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x3000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x2800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x3800)) >> 0x10);
            uVar11 = uVar11 + 1;
            pbVar8 = pbVar8 + 3;
          } while (uVar1 != uVar11);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar7 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar7);
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    if (0 < num_rows) {
      p_Var3 = cinfo->cconvert[1].start_pass;
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar4 = (*output_buf)[output_row];
          pJVar5 = output_buf[1][output_row];
          pJVar6 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar11 = 0;
          do {
            uVar12 = (ulong)pJVar2[uVar11 * 4 + 2];
            uVar9 = (ulong)pJVar2[uVar11 * 4 + 1];
            uVar10 = (ulong)pJVar2[uVar11 * 4];
            pJVar4[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x800) +
                                  *(int *)(p_Var3 + uVar12 * 8) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x1000)) >> 0x10);
            pJVar5[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x2000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x1800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x2800)) >> 0x10);
            pJVar6[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x3000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x2800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x3800)) >> 0x10);
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar7 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar7);
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    if (0 < num_rows) {
      p_Var3 = cinfo->cconvert[1].start_pass;
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar4 = (*output_buf)[output_row];
          pJVar5 = output_buf[1][output_row];
          pJVar6 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar11 = 0;
          do {
            uVar12 = (ulong)pJVar2[uVar11 * 4 + 3];
            uVar9 = (ulong)pJVar2[uVar11 * 4 + 2];
            uVar10 = (ulong)pJVar2[uVar11 * 4 + 1];
            pJVar4[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x800) +
                                  *(int *)(p_Var3 + uVar12 * 8) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x1000)) >> 0x10);
            pJVar5[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x2000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x1800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x2800)) >> 0x10);
            pJVar6[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x3000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x2800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x3800)) >> 0x10);
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar7 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar7);
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    if (0 < num_rows) {
      p_Var3 = cinfo->cconvert[1].start_pass;
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar4 = (*output_buf)[output_row];
          pJVar5 = output_buf[1][output_row];
          pJVar6 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar11 = 0;
          do {
            uVar12 = (ulong)pJVar2[uVar11 * 4 + 1];
            uVar9 = (ulong)pJVar2[uVar11 * 4 + 2];
            uVar10 = (ulong)pJVar2[uVar11 * 4 + 3];
            pJVar4[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x800) +
                                  *(int *)(p_Var3 + uVar12 * 8) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x1000)) >> 0x10);
            pJVar5[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x2000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x1800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x2800)) >> 0x10);
            pJVar6[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x3000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x2800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x3800)) >> 0x10);
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar7 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar7);
    }
    break;
  default:
    if (0 < num_rows) {
      p_Var3 = cinfo->cconvert[1].start_pass;
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar4 = (*output_buf)[output_row];
          pJVar5 = output_buf[1][output_row];
          pJVar6 = output_buf[2][output_row];
          pbVar8 = *input_buf;
          uVar11 = 0;
          do {
            uVar12 = (ulong)*pbVar8;
            uVar9 = (ulong)pbVar8[1];
            uVar10 = (ulong)pbVar8[2];
            pJVar4[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x800) +
                                  *(int *)(p_Var3 + uVar12 * 8) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x1000)) >> 0x10);
            pJVar5[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x2000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x1800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x2800)) >> 0x10);
            pJVar6[uVar11] =
                 (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar9 * 8 + 0x3000) +
                                  *(int *)(p_Var3 + uVar12 * 8 + 0x2800) +
                                 *(int *)(p_Var3 + uVar10 * 8 + 0x3800)) >> 0x10);
            uVar11 = uVar11 + 1;
            pbVar8 = pbVar8 + 3;
          } while (uVar1 != uVar11);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar7 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar7);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    extrgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    extbgr_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  default:
    rgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                             num_rows);
    break;
  }
}